

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  Parser *this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  __allocator_type __a2_1;
  allocator<char> local_451;
  allocator<char> local_450;
  allocator<char> local_44f;
  allocator<char> local_44e;
  allocator<char> local_44d;
  int local_44c;
  char **local_448;
  undefined8 local_440;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_438 [3];
  value_type local_420;
  __allocator_type __a2;
  value_type local_3e0;
  string local_3c0 [32];
  string local_3a0 [32];
  string quickfixConfigFile;
  undefined1 local_360 [8];
  pointer local_358;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_350;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_348;
  string local_340 [32];
  _Alloc_hider local_320;
  size_type local_318;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_310;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_300;
  undefined1 local_2e8 [64];
  _Alloc_hider local_2a8;
  size_type local_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_288;
  Parser local_270;
  Parser newCli;
  Session session;
  
  quickfixConfigFile._M_dataplus._M_p = (pointer)&quickfixConfigFile.field_2;
  quickfixConfigFile._M_string_length = 0;
  quickfixConfigFile.field_2._M_local_buf[0] = '\0';
  local_44c = argc;
  local_448 = argv;
  Catch::Session::Session(&session);
  this = Catch::Session::cli(&session);
  std::__cxx11::string::string<std::allocator<char>>(local_3a0,"user",&local_44d);
  local_2e8._0_8_ = &PTR__ParserRefImpl_002f3b00;
  local_2e8._8_4_ = Optional;
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  local_360 = (undefined1  [8])&__a2;
  p_Var2->_M_use_count = 1;
  p_Var2->_M_weak_count = 1;
  p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_002f3bc0;
  p_Var2[1]._vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_002f3c10;
  local_358 = (pointer)0x0;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::Clara::Detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/ut.cpp:38:21)>,_std::allocator<Catch::Clara::Detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/ut.cpp:38:21)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::Clara::Detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_quickfix[P]quickfix_src_C___test_ut_cpp:38:21)>,_std::allocator<Catch::Clara::Detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_quickfix[P]quickfix_src_C___test_ut_cpp:38:21)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)local_360);
  local_3e0._M_dataplus._M_p = (pointer)0x0;
  local_3e0._M_string_length = 0;
  local_2e8._16_8_ = p_Var2 + 1;
  local_2e8._24_8_ = p_Var2;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_3e0._M_string_length);
  std::__cxx11::string::string((string *)(local_2e8 + 0x20),local_3a0);
  local_2a8._M_p = (pointer)&local_298;
  local_2a0 = 0;
  local_298._M_local_buf[0] = '\0';
  local_2e8._0_8_ = &PTR__Opt_002f4058;
  local_288.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_288.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_288.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3e0,"--quickfix-config-file",&local_44e);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_288,&local_3e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&__a2,"QuickFIX config file for tests",&local_44f);
  std::__cxx11::string::_M_assign((string *)&local_2a8);
  Catch::Clara::Parser::operator|(&local_270,this,(Opt *)local_2e8);
  std::__cxx11::string::string<std::allocator<char>>(local_3c0,"user",&local_450);
  local_360 = (undefined1  [8])&PTR__ParserRefImpl_002f3b00;
  local_358 = (pointer)((ulong)local_358 & 0xffffffff00000000);
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  local_420._M_dataplus._M_p = (pointer)&__a2_1;
  p_Var2->_M_use_count = 1;
  p_Var2->_M_weak_count = 1;
  p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_002f3c60;
  p_Var2[1]._vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_002f3cb0;
  local_420._M_string_length = 0;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::Clara::Detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/ut.cpp:43:21)>,_std::allocator<Catch::Clara::Detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/ut.cpp:43:21)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::Clara::Detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_quickfix[P]quickfix_src_C___test_ut_cpp:43:21)>,_std::allocator<Catch::Clara::Detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_quickfix[P]quickfix_src_C___test_ut_cpp:43:21)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)&local_420);
  local_440 = 0;
  a_Stack_438[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_350 = p_Var2 + 1;
  local_348._M_pi = p_Var2;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_438);
  std::__cxx11::string::string(local_340,local_3c0);
  local_320._M_p = (pointer)&local_310;
  local_318 = 0;
  local_310._M_local_buf[0] = '\0';
  local_360 = (undefined1  [8])&PTR__Opt_002f4058;
  local_300.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_300.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_300.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_420,"--quickfix-spec-path",(allocator<char> *)&__a2_1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_300,&local_420);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_440,"QuickFIX spec path",&local_451);
  std::__cxx11::string::_M_assign((string *)&local_320);
  Catch::Clara::Parser::operator|(&newCli,&local_270,(Opt *)local_360);
  std::__cxx11::string::~string((string *)&local_440);
  std::__cxx11::string::~string((string *)&local_420);
  Catch::Clara::Opt::~Opt((Opt *)local_360);
  std::__cxx11::string::~string(local_3c0);
  Catch::Clara::Parser::~Parser(&local_270);
  std::__cxx11::string::~string((string *)&__a2);
  std::__cxx11::string::~string((string *)&local_3e0);
  Catch::Clara::Opt::~Opt((Opt *)local_2e8);
  std::__cxx11::string::~string(local_3a0);
  Catch::Session::cli(&session,&newCli);
  iVar1 = Catch::Session::run<char>(&session,local_44c,local_448);
  Catch::Clara::Parser::~Parser(&newCli);
  Catch::Session::~Session(&session);
  std::__cxx11::string::~string((string *)&quickfixConfigFile);
  return iVar1;
}

Assistant:

int main(int argc, char **argv) {
  std::string quickfixConfigFile;

  Catch::Session session;
  auto &cli = session.cli();
  auto newCli = cli
                | Catch::Clara::Opt(
                    [](std::string quickfixConfigFile) {
                      FIX::TestSettings::sessionSettings = FIX::SessionSettings(quickfixConfigFile);
                    },
                    "user")["--quickfix-config-file"]("QuickFIX config file for tests")
                | Catch::Clara::Opt(
                    [](std::string quickfixSpecPath) { FIX::TestSettings::specPath = quickfixSpecPath; },
                    "user")["--quickfix-spec-path"]("QuickFIX spec path");
  session.cli(newCli);

  return session.run(argc, argv);
}